

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

bool __thiscall
siamese::DecoderPacketWindow::GrowWindow(DecoderPacketWindow *this,uint windowElementEnd)

{
  uint uVar1;
  bool bVar2;
  DecoderSubwindow *pDVar3;
  uint elements;
  uint i;
  ulong uVar4;
  
  uVar1 = (this->Subwindows).Size;
  uVar4 = (ulong)uVar1;
  elements = windowElementEnd + 0x47 >> 6;
  if (uVar1 < elements) {
    bVar2 = pktalloc::LightVector<siamese::DecoderSubwindow_*,_25U>::SetSize_Copy
                      (&this->Subwindows,elements);
    if (!bVar2) {
      return false;
    }
    for (; (uint)uVar4 < elements; uVar4 = uVar4 + 1) {
      pDVar3 = pktalloc::Allocator::Construct<siamese::DecoderSubwindow>(this->TheAllocator);
      if (pDVar3 == (DecoderSubwindow *)0x0) {
        return false;
      }
      (this->Subwindows).DataPtr[uVar4] = pDVar3;
    }
  }
  if (this->Count < windowElementEnd) {
    this->Count = windowElementEnd;
  }
  return true;
}

Assistant:

bool DecoderPacketWindow::GrowWindow(const unsigned windowElementEnd)
{
    // Note: Adding a buffer of lane count to create space ahead for snapshots
    // as a subwindow is filled and we need to store its snapshot
    const unsigned subwindowCount   = Subwindows.GetSize();
    const unsigned subwindowsNeeded = (windowElementEnd + kColumnLaneCount + kSubwindowSize - 1) / kSubwindowSize;

    if (subwindowsNeeded > subwindowCount)
    {
        // Note resizing larger will keep old data in the vector
        if (!Subwindows.SetSize_Copy(subwindowsNeeded))
            return false;

        // For each subwindow to initialize:
        for (unsigned i = subwindowCount; i < subwindowsNeeded; ++i)
        {
            DecoderSubwindow* subwindow = TheAllocator->Construct<DecoderSubwindow>();
            if (!subwindow)
                return false; // Out of memory

            Subwindows.GetRef(i) = subwindow;
        }
    }

    // If this element expands the window:
    if (windowElementEnd > Count)
        Count = windowElementEnd;

    return true;
}